

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.h
# Opt level: O3

void __thiscall
OpenMPAllocateDirective::addAllocateList(OpenMPAllocateDirective *this,char *_allocate_list)

{
  pointer *pppcVar1;
  iterator __position;
  char *local_8;
  
  __position._M_current =
       (this->allocate_list).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->allocate_list).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_8 = _allocate_list;
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
              ((vector<char_const*,std::allocator<char_const*>> *)&this->allocate_list,__position,
               &local_8);
  }
  else {
    *__position._M_current = _allocate_list;
    pppcVar1 = &(this->allocate_list).
                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  return;
}

Assistant:

std::vector<const char*>* getAllocateList () { return &allocate_list; }